

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O0

error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
* __thiscall
pstore::http::
send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
           *__return_storage_ptr__,http *this,
          _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
          *sender,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io,close_status_code status)

{
  http *this_00;
  span<const_unsigned_char,__1L> *in_R9;
  span<const_unsigned_short,__1L> sVar1;
  extent_type<_1L> local_50;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_40;
  _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
  *local_30;
  uint16_t local_24;
  uint16_t local_22;
  uint16_t ns;
  http *phStack_20;
  close_status_code status_local;
  _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
  *sender_local;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> io_local
  ;
  
  local_22 = (uint16_t)io._M_data;
  phStack_20 = this;
  sender_local = sender;
  io_local._M_data = (descriptor<pstore::details::posix_descriptor_traits> *)__return_storage_ptr__;
  log<unsigned_short>(info,"Sending close frame code=",local_22);
  local_24 = host_to_network<unsigned_short>(local_22);
  this_00 = phStack_20;
  local_30 = sender_local;
  sVar1 = pstore::gsl::make_span<unsigned_short_const>(&local_24,1);
  local_50 = sVar1.storage_.super_extent_type<_1L>.size_;
  sVar1.storage_.super_extent_type<_1L>.size_ = sVar1.storage_.data_;
  local_40 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
             pstore::gsl::as_bytes<unsigned_short_const,_1l>((gsl *)local_50.size_,sVar1);
  send_message<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
            (__return_storage_ptr__,this_00,local_30,
             (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
              )0x8,(opcode)&local_40,in_R9);
  return __return_storage_ptr__;
}

Assistant:

error_or<IO> send_close_frame (Sender const sender, IO const io,
                                       close_status_code const status) {
            log (logger::priority::info,
                 "Sending close frame code=", static_cast<std::uint16_t> (status));
            PSTORE_STATIC_ASSERT ((
                std::is_same<std::underlying_type<close_status_code>::type, std::uint16_t>::value));
            std::uint16_t const ns = host_to_network (static_cast<std::uint16_t> (status));
            return send_message (sender, io, opcode::close, as_bytes (gsl::make_span (&ns, 1)));
        }